

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChSystem::GetBodyAppliedForce
          (ChVector<double> *__return_storage_ptr__,ChSystem *this,ChBody *body)

{
  int iVar1;
  undefined4 extraout_var;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> VStack_58;
  
  if (this->is_initialized == false) {
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
  }
  else {
    if (this->applied_forces_current == false) {
      iVar1 = (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x13])(this)
      ;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                (&(this->applied_forces).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar1);
      (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0xe])
                (0x3ff0000000000000,this,&this->applied_forces);
      this->applied_forces_current = true;
    }
    iVar1 = (*(body->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3c])(body);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&VStack_58,&this->applied_forces,(long)*(int *)(CONCAT44(extraout_var,iVar1) + 0x30),
               3);
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &VStack_58,(type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChSystem::GetBodyAppliedForce(ChBody* body) {
    if (!is_initialized)
        return ChVector<>(0, 0, 0);

    if (!applied_forces_current) {
        applied_forces.setZero(this->GetNcoords_v());
        LoadResidual_F(applied_forces, 1.0);
        applied_forces_current = true;
    }
    return applied_forces.segment(body->Variables().GetOffset() + 0, 3);
}